

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::contactTest
          (btCollisionWorld *this,btCollisionObject *colObj,ContactResultCallback *resultCallback)

{
  long *plVar1;
  btCollisionWorld *world;
  btTransform *pbVar2;
  btCollisionObject *in_RSI;
  btCollisionObject *in_RDI;
  btSingleContactCallback contactCB;
  btVector3 aabbMax;
  btVector3 aabbMin;
  ContactResultCallback *in_stack_ffffffffffffff68;
  btSingleContactCallback *this_00;
  undefined1 local_58 [32];
  btVector3 local_38;
  btSingleContactCallback local_28;
  
  this_00 = &local_28;
  local_28.m_resultCallback = (ContactResultCallback *)in_RSI;
  btVector3::btVector3((btVector3 *)this_00);
  btVector3::btVector3(&local_38);
  world = (btCollisionWorld *)
          btCollisionObject::getCollisionShape((btCollisionObject *)local_28.m_resultCallback);
  pbVar2 = btCollisionObject::getWorldTransform((btCollisionObject *)local_28.m_resultCallback);
  (*world->_vptr_btCollisionWorld[2])(world,pbVar2,this_00,&local_38);
  btSingleContactCallback::btSingleContactCallback(this_00,in_RDI,world,in_stack_ffffffffffffff68);
  plVar1 = *(long **)((in_RDI->m_interpolationWorldTransform).m_basis.m_el[1].m_floats + 2);
  (**(code **)(*plVar1 + 0x38))(plVar1,this_00,&local_38,local_58);
  btSingleContactCallback::~btSingleContactCallback((btSingleContactCallback *)0x17cd35);
  return;
}

Assistant:

void	btCollisionWorld::contactTest( btCollisionObject* colObj, ContactResultCallback& resultCallback)
{
	btVector3 aabbMin,aabbMax;
	colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(),aabbMin,aabbMax);
	btSingleContactCallback	contactCB(colObj,this,resultCallback);
	
	m_broadphasePairCache->aabbTest(aabbMin,aabbMax,contactCB);
}